

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ComparatorDisposer::ComparatorDisposer
          (ComparatorDisposer *this,ComparatorDisposer *other)

{
  shared_ptr<ApprovalTests::ApprovalComparator> *in_RSI;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_RDI;
  
  *(undefined1 *)
   &(in_RDI->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = 1;
  (in_RDI->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi =
       (in_RSI->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 1));
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::shared_ptr(in_RSI,in_RDI);
  *(undefined1 *)
   &(in_RSI->super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = 0;
  return;
}

Assistant:

ComparatorDisposer::ComparatorDisposer(ComparatorDisposer&& other) noexcept
        : comparators(other.comparators)
        , ext_(std::move(other.ext_))
        , previousComparator(std::move(other.previousComparator))
    {
        other.isActive = false;
    }